

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_simple
                   (char_t *s,char_t end_quote)

{
  char_t *pcVar1;
  byte bVar2;
  byte *s_00;
  gap g;
  gap local_18;
  
  local_18.end = (char_t *)0x0;
  local_18.size = 0;
  do {
    do {
      s_00 = (byte *)s;
      bVar2 = *s_00;
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) goto LAB_0017b534;
      bVar2 = s_00[1];
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
        s_00 = s_00 + 1;
        goto LAB_0017b534;
      }
      bVar2 = s_00[2];
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
        s_00 = s_00 + 2;
        goto LAB_0017b534;
      }
      bVar2 = s_00[3];
      s = (char_t *)(s_00 + 4);
    } while (((anonymous_namespace)::chartype_table[bVar2] & 2) == 0);
    s_00 = s_00 + 3;
LAB_0017b534:
    if (bVar2 == end_quote) {
      pcVar1 = gap::flush(&local_18,(char_t *)s_00);
      *pcVar1 = '\0';
      return (char_t *)(s_00 + 1);
    }
    if (bVar2 == 0) {
      return (char_t *)0x0;
    }
    s = (char_t *)(s_00 + 1);
  } while( true );
}

Assistant:

gap(): end(0), size(0)
		{
		}